

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O2

Own<capnp::compiler::NodeTranslator::BrandScope> __thiscall
kj::
refcounted<capnp::compiler::NodeTranslator::BrandScope,kj::Own<capnp::compiler::NodeTranslator::BrandScope>,unsigned_long&,unsigned_int&>
          (kj *this,Own<capnp::compiler::NodeTranslator::BrandScope> *params,unsigned_long *params_1
          ,uint *params_2)

{
  uint uVar1;
  BrandScope *pBVar2;
  unsigned_long uVar3;
  Refcounted *refcounted;
  undefined8 *puVar4;
  BrandScope *extraout_RDX;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar5;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_30;
  
  puVar4 = (undefined8 *)operator_new(0x50);
  local_30.disposer = params->disposer;
  pBVar2 = params->ptr;
  params->ptr = (BrandScope *)0x0;
  uVar3 = *params_1;
  uVar1 = *params_2;
  *puVar4 = &PTR_disposeImpl_0021d240;
  puVar4[2] = pBVar2->errorReporter;
  puVar4[3] = local_30.disposer;
  local_30.ptr = (BrandScope *)0x0;
  puVar4[4] = pBVar2;
  puVar4[5] = uVar3;
  *(uint *)(puVar4 + 6) = uVar1;
  *(undefined1 *)((long)puVar4 + 0x34) = 0;
  puVar4[9] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  *(undefined4 *)(puVar4 + 1) = 1;
  *(undefined8 **)this = puVar4;
  *(undefined8 **)(this + 8) = puVar4;
  Own<capnp::compiler::NodeTranslator::BrandScope>::dispose(&local_30);
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}